

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SemanticAnalysis.cpp
# Opt level: O0

void __thiscall
luna::SemanticAnalysisVisitor::Visit
          (SemanticAnalysisVisitor *this,RepeatStatement *repeat_stmt,void *data)

{
  pointer pSVar1;
  undefined8 in_RSI;
  SemanticAnalysisVisitor *in_RDI;
  ExpVarData exp_var_data;
  Guard g;
  Guard l;
  SyntaxTree *old_loop;
  Guard *this_00;
  function<void_()> *this_01;
  function<void_()> *enter;
  Guard *in_stack_fffffffffffffed0;
  Guard local_118 [4];
  SyntaxTree *local_98;
  function<void_()> local_90;
  undefined8 local_68;
  function<void_()> local_60 [2];
  SyntaxTree *local_20;
  undefined8 local_10;
  
  local_10 = in_RSI;
  local_20 = GetLoopAST(in_RDI);
  local_68 = local_10;
  this_01 = local_60;
  std::function<void()>::
  function<luna::SemanticAnalysisVisitor::Visit(luna::RepeatStatement*,void*)::__0,void>
            (this_01,(anon_class_16_2_8d8e7219 *)in_RDI);
  local_98 = local_20;
  enter = &local_90;
  std::function<void()>::
  function<luna::SemanticAnalysisVisitor::Visit(luna::RepeatStatement*,void*)::__1,void>
            (this_01,(anon_class_16_2_3ebab7f7 *)in_RDI);
  Guard::Guard(in_stack_fffffffffffffed0,enter,this_01);
  std::function<void_()>::~function((function<void_()> *)0x190e30);
  std::function<void_()>::~function((function<void_()> *)0x190e3d);
  std::function<void()>::
  function<luna::SemanticAnalysisVisitor::Visit(luna::RepeatStatement*,void*)::__2,void>
            (this_01,(anon_class_8_1_8991fb9c *)in_RDI);
  this_00 = local_118;
  std::function<void()>::
  function<luna::SemanticAnalysisVisitor::Visit(luna::RepeatStatement*,void*)::__3,void>
            (this_01,(anon_class_8_1_8991fb9c *)in_RDI);
  Guard::Guard(in_stack_fffffffffffffed0,enter,this_01);
  std::function<void_()>::~function((function<void_()> *)0x190e9a);
  std::function<void_()>::~function((function<void_()> *)0x190ea4);
  ExpVarData::ExpVarData((ExpVarData *)&stack0xfffffffffffffed4,SemanticOp_Read);
  pSVar1 = std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>::operator->
                     ((unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)
                      0x190ec6);
  (*pSVar1->_vptr_SyntaxTree[2])(pSVar1,in_RDI,0);
  pSVar1 = std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>::operator->
                     ((unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)
                      0x190eee);
  (*pSVar1->_vptr_SyntaxTree[2])(pSVar1,in_RDI,&stack0xfffffffffffffed4);
  Guard::~Guard(this_00);
  Guard::~Guard(this_00);
  return;
}

Assistant:

void SemanticAnalysisVisitor::Visit(RepeatStatement *repeat_stmt, void *data)
    {
        SEMANTIC_ANALYSIS_LOOP_GUARD(repeat_stmt);
        SEMANTIC_ANALYSIS_GUARD(EnterBlock, LeaveBlock);

        ExpVarData exp_var_data{ SemanticOp_Read };
        repeat_stmt->block_->Accept(this, nullptr);
        repeat_stmt->exp_->Accept(this, &exp_var_data);
    }